

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

void __thiscall QResource::QResource(QResource *this,QString *file,QLocale *locale)

{
  QResourcePrivate *p;
  QResource *in_RDX;
  QResourcePrivate *in_RSI;
  QString *in_RDI;
  QResourcePrivate *d;
  QString *this_00;
  
  this_00 = in_RDI;
  p = (QResourcePrivate *)operator_new(0x90);
  QResourcePrivate::QResourcePrivate(in_RSI,in_RDX);
  QScopedPointer<QResourcePrivate,_QScopedPointerDeleter<QResourcePrivate>_>::QScopedPointer
            ((QScopedPointer<QResourcePrivate,_QScopedPointerDeleter<QResourcePrivate>_> *)this_00,p
            );
  d_func((QResource *)0x2e768e);
  QString::operator=(this_00,in_RDI);
  QLocale::operator=((QLocale *)this_00,(QLocale *)in_RDI);
  return;
}

Assistant:

QResource::QResource(const QString &file, const QLocale &locale) : d_ptr(new QResourcePrivate(this))
{
    Q_D(QResource);
    d->fileName = file;
    d->locale = locale;
}